

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_loads_statics.cpp
# Opt level: O2

MyLoadCustom * __thiscall test_1::MyLoadCustom::Clone(MyLoadCustom *this)

{
  ChLoadCustom *this_00;
  
  this_00 = (ChLoadCustom *)operator_new(0x60);
  chrono::ChLoadCustom::ChLoadCustom(this_00,&this->super_ChLoadCustom);
  *(undefined ***)this_00 = &PTR__ChLoadCustom_00146448;
  return (MyLoadCustom *)this_00;
}

Assistant:

virtual MyLoadCustom* Clone() const override { return new MyLoadCustom(*this); }